

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absUtil.c
# Opt level: O3

Vec_Int_t * Gia_FlaConvertToGla(Gia_Man_t *p,Vec_Int_t *vFla)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  
  Gia_ManIncrementTravId(p);
  if (p->nObjs < 1) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->nTravIdsAlloc < 1) {
LAB_00629e58:
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x261,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  pGVar1 = p->pObjs;
  iVar2 = p->nTravIds;
  piVar4 = p->pTravIds;
  *piVar4 = iVar2;
  pVVar3 = p->vCis;
  iVar7 = p->nRegs;
  iVar6 = pVVar3->nSize;
  if (iVar7 < iVar6) {
    lVar8 = 0;
    do {
      if (iVar6 <= lVar8) goto LAB_00629e39;
      iVar6 = pVVar3->pArray[lVar8];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_00629e1a;
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      if (p->nTravIdsAlloc <= iVar6) goto LAB_00629e58;
      piVar4[iVar6] = iVar2;
      lVar8 = lVar8 + 1;
      iVar7 = p->nRegs;
      iVar6 = pVVar3->nSize;
    } while (lVar8 < iVar6 - iVar7);
  }
  if (0 < iVar7) {
    lVar8 = 0;
    do {
      uVar9 = (ulong)(uint)(pVVar3->nSize - iVar7) + lVar8;
      iVar6 = (int)uVar9;
      if ((iVar6 < 0) || (pVVar3->nSize <= iVar6)) goto LAB_00629e39;
      iVar6 = pVVar3->pArray[uVar9 & 0xffffffff];
      if (((long)iVar6 < 0) || (iVar10 = p->nObjs, iVar10 <= iVar6)) goto LAB_00629e1a;
      if (pGVar1 == (Gia_Obj_t *)0x0) goto LAB_00629c81;
      if (vFla->nSize <= lVar8) goto LAB_00629e39;
      if (vFla->pArray[lVar8] == 0) {
        if (p->nTravIdsAlloc <= iVar6) goto LAB_00629e58;
        piVar4[iVar6] = iVar2;
        iVar7 = p->nRegs;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar7);
  }
  iVar10 = p->nObjs;
LAB_00629c81:
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar10 - 1U) {
    iVar2 = iVar10;
  }
  pVVar3->nCap = iVar2;
  if (iVar2 == 0) {
    pVVar3->pArray = (int *)0x0;
    pVVar3->nSize = iVar10;
  }
  else {
    piVar4 = (int *)malloc((long)iVar2 << 2);
    pVVar3->pArray = piVar4;
    pVVar3->nSize = iVar10;
    if (piVar4 != (int *)0x0) {
      memset(piVar4,0,(long)iVar10 << 2);
      goto LAB_00629ce3;
    }
  }
  piVar4 = (int *)0x0;
LAB_00629ce3:
  if (iVar10 < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  *piVar4 = 1;
  pVVar5 = p->vCos;
  iVar2 = pVVar5->nSize;
  if (iVar7 < iVar2) {
    lVar8 = 0;
    do {
      if (iVar2 <= lVar8) goto LAB_00629e39;
      iVar2 = pVVar5->pArray[lVar8];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_00629e1a;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar2;
      Gia_FlaConvertToGla_rec(p,pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff),pVVar3);
      lVar8 = lVar8 + 1;
      iVar7 = p->nRegs;
      pVVar5 = p->vCos;
      iVar2 = pVVar5->nSize;
    } while (lVar8 < iVar2 - iVar7);
  }
  if (0 < iVar7) {
    lVar8 = 0;
    do {
      iVar2 = p->vCos->nSize;
      uVar9 = (ulong)(uint)(iVar2 - iVar7) + lVar8;
      iVar6 = (int)uVar9;
      if ((iVar6 < 0) || (iVar2 <= iVar6)) {
LAB_00629e39:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = p->vCos->pArray[uVar9 & 0xffffffff];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
LAB_00629e1a:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return pVVar3;
      }
      if (vFla->nSize <= lVar8) goto LAB_00629e39;
      if (vFla->pArray[lVar8] != 0) {
        pGVar1 = p->pObjs + iVar2;
        Gia_FlaConvertToGla_rec
                  (p,pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff),pVVar3);
        iVar7 = p->nRegs;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar7);
  }
  return pVVar3;
}

Assistant:

Vec_Int_t * Gia_FlaConvertToGla( Gia_Man_t * p, Vec_Int_t * vFla )
{
    Vec_Int_t * vGla;
    Gia_Obj_t * pObj;
    int i;
    // mark const0 and relevant CI objects
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent(p, Gia_ManConst0(p));
    Gia_ManForEachPi( p, pObj, i )
        Gia_ObjSetTravIdCurrent(p, pObj);
    Gia_ManForEachRo( p, pObj, i )
        if ( !Vec_IntEntry(vFla, i) )
            Gia_ObjSetTravIdCurrent(p, pObj);
    // label all objects reachable from the PO and selected flops
    vGla = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_IntWriteEntry( vGla, 0, 1 );
    Gia_ManForEachPo( p, pObj, i )
        Gia_FlaConvertToGla_rec( p, Gia_ObjFanin0(pObj), vGla );
    Gia_ManForEachRi( p, pObj, i )
        if ( Vec_IntEntry(vFla, i) )
            Gia_FlaConvertToGla_rec( p, Gia_ObjFanin0(pObj), vGla );
    return vGla;
}